

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::
deserialize<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>
          (Deserializer *this,
          optional<std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>_> *opt
          )

{
  bool bVar1;
  vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_> v;
  array<dap::SourceBreakpoint> local_28;
  
  local_28.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = deserialize<dap::SourceBreakpoint>(this,&local_28);
  if (bVar1) {
    optional<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>>::operator=
              ((optional<std::vector<dap::SourceBreakpoint,std::allocator<dap::SourceBreakpoint>>> *
               )opt,&local_28);
  }
  std::vector<dap::SourceBreakpoint,_std::allocator<dap::SourceBreakpoint>_>::~vector(&local_28);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}